

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGSchemaTypeCheck(void *data,xmlChar *type,xmlChar *value,void **result,xmlNodePtr node)

{
  int iVar1;
  xmlSchemaTypePtr type_00;
  int ret;
  xmlSchemaTypePtr_conflict typ;
  xmlNodePtr node_local;
  void **result_local;
  xmlChar *value_local;
  xmlChar *type_local;
  void *data_local;
  
  if ((type == (xmlChar *)0x0) || (value == (xmlChar *)0x0)) {
    data_local._4_4_ = -1;
  }
  else {
    type_00 = xmlSchemaGetPredefinedType(type,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
    if (type_00 == (xmlSchemaTypePtr)0x0) {
      data_local._4_4_ = -1;
    }
    else {
      iVar1 = xmlSchemaValPredefTypeNode(type_00,value,(xmlSchemaValPtr *)result,node);
      if (iVar1 == 2) {
        data_local._4_4_ = 2;
      }
      else if (iVar1 == 0) {
        data_local._4_4_ = 1;
      }
      else if (iVar1 < 1) {
        data_local._4_4_ = -1;
      }
      else {
        data_local._4_4_ = 0;
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

static int
xmlRelaxNGSchemaTypeCheck(void *data ATTRIBUTE_UNUSED,
                          const xmlChar * type,
                          const xmlChar * value,
                          void **result, xmlNodePtr node)
{
    xmlSchemaTypePtr typ;
    int ret;

    if ((type == NULL) || (value == NULL))
        return (-1);
    typ = xmlSchemaGetPredefinedType(type,
                                     BAD_CAST
                                     "http://www.w3.org/2001/XMLSchema");
    if (typ == NULL)
        return (-1);
    ret = xmlSchemaValPredefTypeNode(typ, value,
                                     (xmlSchemaValPtr *) result, node);
    if (ret == 2)               /* special ID error code */
        return (2);
    if (ret == 0)
        return (1);
    if (ret > 0)
        return (0);
    return (-1);
}